

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transactions.cpp
# Opt level: O2

vector<RPCResult,_std::allocator<RPCResult>_> * wallet::TransactionDescriptionString(void)

{
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string description_14;
  string description_15;
  string description_16;
  string description_17;
  string description_18;
  string description_19;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_14;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_15;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_16;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_17;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_18;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_19;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_20;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  long lVar13;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  undefined4 in_stack_ffffffffffffeb68;
  undefined4 uVar14;
  undefined1 in_stack_ffffffffffffeb6c [12];
  pointer in_stack_ffffffffffffeb78;
  pointer pRVar15;
  pointer in_stack_ffffffffffffeb80;
  pointer pRVar16;
  _Alloc_hider in_stack_ffffffffffffeb88;
  _Alloc_hider _Var17;
  undefined1 in_stack_ffffffffffffeb90 [24];
  undefined1 in_stack_ffffffffffffeba8 [16];
  pointer in_stack_ffffffffffffebb8;
  pointer pRVar18;
  allocator<char> local_142a;
  allocator<char> local_1429;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1428;
  allocator<char> local_140a;
  allocator<char> local_1409;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1408;
  allocator<char> local_13e9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_13e8;
  allocator<char> local_13c9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_13c8;
  allocator<char> local_13ab;
  allocator<char> local_13aa;
  allocator_type local_13a9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_13a8;
  allocator<char> local_138a;
  allocator<char> local_1389;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1388;
  allocator<char> local_136a;
  allocator<char> local_1369;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1368;
  allocator<char> local_134a;
  allocator<char> local_1349;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1348;
  allocator<char> local_132b;
  allocator<char> local_132a;
  allocator_type local_1329;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1328;
  allocator<char> local_130a;
  allocator<char> local_1309;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1308;
  allocator<char> local_12ea;
  allocator<char> local_12e9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_12e8;
  allocator<char> local_12ca;
  allocator<char> local_12c9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_12c8;
  allocator<char> local_12aa;
  allocator<char> local_12a9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_12a8;
  allocator<char> local_1289;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1288;
  allocator<char> local_126a;
  allocator<char> local_1269;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1268;
  allocator<char> local_124a;
  allocator<char> local_1249;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1248;
  allocator<char> local_122a;
  allocator<char> local_1229;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1228;
  allocator<char> local_120a;
  allocator<char> local_1209;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1208;
  allocator<char> local_11ea;
  allocator<char> local_11e9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_11e8;
  allocator<char> local_11c2;
  allocator<char> local_11c1;
  string local_11c0 [32];
  string local_11a0 [32];
  RPCResult local_1180;
  string local_10f8 [32];
  string local_10d8 [32];
  string local_10b8 [32];
  string local_1098 [32];
  string local_1078 [32];
  string local_1058 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1038;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1018;
  string local_ff8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fb8;
  string local_f98 [32];
  string local_f78 [32];
  string local_f58 [32];
  string local_f38 [32];
  string local_f18 [32];
  RPCResult local_ef8;
  string local_e70 [32];
  string local_e50 [32];
  string local_e30 [32];
  string local_e10 [32];
  string local_df0 [32];
  string local_dd0 [32];
  string local_db0 [32];
  string local_d90 [32];
  RPCResult local_d70;
  string local_ce8 [32];
  string local_cc8 [32];
  string local_ca8 [32];
  string local_c88 [32];
  string local_c68 [32];
  string local_c48 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c08;
  string local_be8 [32];
  string local_bc8 [32];
  string local_ba8 [32];
  string local_b88 [32];
  string local_b68 [32];
  string local_b48 [32];
  string local_b28 [32];
  string local_b08 [32];
  string local_ae8 [32];
  string local_ac8 [32];
  string local_aa8 [32];
  string local_a88 [32];
  string local_a68 [32];
  RPCResult local_a48 [4];
  RPCResult local_828;
  RPCResult local_7a0;
  RPCResult local_718;
  RPCResult local_690;
  RPCResult local_608;
  RPCResult local_580;
  RPCResult local_4f8;
  RPCResult local_470;
  RPCResult local_3e8;
  RPCResult local_360;
  RPCResult local_2d8;
  RPCResult local_250;
  RPCResult local_1c8;
  RPCResult local_140;
  RPCResult local_b8;
  long local_30;
  
  local_1038.field_2._M_allocated_capacity = 0;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_a68,"confirmations",&local_11c1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_a88,
             "The number of confirmations for the transaction. Negative confirmations means the\ntransaction conflicted that many blocks ago."
             ,&local_11c2);
  local_11e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_11e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_11e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._4_12_ = in_stack_ffffffffffffeb6c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb68;
  m_key_name.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeb78;
  m_key_name.field_2._8_8_ = in_stack_ffffffffffffeb80;
  description._M_string_length = in_stack_ffffffffffffeb90._0_8_;
  description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffeb90._8_16_;
  description._M_dataplus._M_p = in_stack_ffffffffffffeb88._M_p;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffebb8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffeba8._0_8_;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffeba8._8_8_;
  RPCResult::RPCResult(local_a48,NUM,m_key_name,description,inner,SUB81(local_a68,0));
  std::__cxx11::string::string<std::allocator<char>>(local_aa8,"generated",&local_11e9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_ac8,"Only present if the transaction\'s only input is a coinbase one.",
             &local_11ea);
  local_1208.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1208.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1208.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar2._12_8_ = in_stack_ffffffffffffeb78;
  auVar2._0_12_ = in_stack_ffffffffffffeb6c;
  auVar2._20_8_ = in_stack_ffffffffffffeb80;
  auVar2._28_4_ = 0;
  description_00._M_string_length = in_stack_ffffffffffffeb90._0_8_;
  description_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffeb90._8_16_;
  description_00._M_dataplus._M_p = in_stack_ffffffffffffeb88._M_p;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebb8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffeba8._0_8_;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffeba8._8_8_;
  RPCResult::RPCResult
            (local_a48 + 1,BOOL,(string)(auVar2 << 0x20),SUB81(local_aa8,0),description_00,inner_00,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_ae8,"trusted",&local_1209);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b08,
             "Whether we consider the transaction to be trusted and safe to spend from.\nOnly present when the transaction has 0 confirmations (or negative confirmations, if conflicted)."
             ,&local_120a);
  local_1228.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1228.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1228.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar3._12_8_ = in_stack_ffffffffffffeb78;
  auVar3._0_12_ = in_stack_ffffffffffffeb6c;
  auVar3._20_8_ = in_stack_ffffffffffffeb80;
  auVar3._28_4_ = 0;
  description_01._M_string_length = in_stack_ffffffffffffeb90._0_8_;
  description_01.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffeb90._8_16_;
  description_01._M_dataplus._M_p = in_stack_ffffffffffffeb88._M_p;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebb8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffeba8._0_8_;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffeba8._8_8_;
  RPCResult::RPCResult
            (local_a48 + 2,BOOL,(string)(auVar3 << 0x20),SUB81(local_ae8,0),description_01,inner_01,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_b28,"blockhash",&local_1229);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b48,"The block hash containing the transaction.",&local_122a);
  local_1248.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1248.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1248.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar4._12_8_ = in_stack_ffffffffffffeb78;
  auVar4._0_12_ = in_stack_ffffffffffffeb6c;
  auVar4._20_8_ = in_stack_ffffffffffffeb80;
  auVar4._28_4_ = 0;
  description_02._M_string_length = in_stack_ffffffffffffeb90._0_8_;
  description_02.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffeb90._8_16_;
  description_02._M_dataplus._M_p = in_stack_ffffffffffffeb88._M_p;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebb8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffeba8._0_8_;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffeba8._8_8_;
  RPCResult::RPCResult
            (local_a48 + 3,STR_HEX,(string)(auVar4 << 0x20),SUB81(local_b28,0),description_02,
             inner_02,true);
  std::__cxx11::string::string<std::allocator<char>>(local_b68,"blockheight",&local_1249);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b88,"The block height containing the transaction.",&local_124a);
  local_1268.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1268.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1268.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar5._12_8_ = in_stack_ffffffffffffeb78;
  auVar5._0_12_ = in_stack_ffffffffffffeb6c;
  auVar5._20_8_ = in_stack_ffffffffffffeb80;
  auVar5._28_4_ = 0;
  description_03._M_string_length = in_stack_ffffffffffffeb90._0_8_;
  description_03.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffeb90._8_16_;
  description_03._M_dataplus._M_p = in_stack_ffffffffffffeb88._M_p;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebb8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffeba8._0_8_;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffeba8._8_8_;
  RPCResult::RPCResult
            (&local_828,NUM,(string)(auVar5 << 0x20),SUB81(local_b68,0),description_03,inner_03,true
            );
  std::__cxx11::string::string<std::allocator<char>>(local_ba8,"blockindex",&local_1269);
  std::__cxx11::string::string<std::allocator<char>>
            (local_bc8,"The index of the transaction in the block that includes it.",&local_126a);
  local_1288.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1288.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1288.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar6._12_8_ = in_stack_ffffffffffffeb78;
  auVar6._0_12_ = in_stack_ffffffffffffeb6c;
  auVar6._20_8_ = in_stack_ffffffffffffeb80;
  auVar6._28_4_ = 0;
  description_04._M_string_length = in_stack_ffffffffffffeb90._0_8_;
  description_04.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffeb90._8_16_;
  description_04._M_dataplus._M_p = in_stack_ffffffffffffeb88._M_p;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebb8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffeba8._0_8_;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffeba8._8_8_;
  RPCResult::RPCResult
            (&local_7a0,NUM,(string)(auVar6 << 0x20),SUB81(local_ba8,0),description_04,inner_04,true
            );
  std::__cxx11::string::string<std::allocator<char>>(local_be8,"blocktime",&local_1289);
  std::operator+(&local_c28,"The block time expressed in ",&UNIX_EPOCH_TIME_abi_cxx11_);
  std::operator+(&local_c08,&local_c28,".");
  local_12a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_12a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar14 = 0;
  auVar7._12_8_ = in_stack_ffffffffffffeb78;
  auVar7._0_12_ = in_stack_ffffffffffffeb6c;
  auVar7._20_8_ = in_stack_ffffffffffffeb80;
  auVar7._28_4_ = 0;
  description_05._M_string_length = in_stack_ffffffffffffeb90._0_8_;
  description_05.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffeb90._8_16_;
  description_05._M_dataplus._M_p = in_stack_ffffffffffffeb88._M_p;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebb8;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffeba8._0_8_;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffeba8._8_8_;
  RPCResult::RPCResult
            (&local_718,NUM_TIME,(string)(auVar7 << 0x20),SUB81(local_be8,0),description_05,inner_05
             ,true);
  std::__cxx11::string::string<std::allocator<char>>(local_c48,"txid",&local_12a9);
  std::__cxx11::string::string<std::allocator<char>>(local_c68,"The transaction id.",&local_12aa);
  local_12c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_12c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._4_12_ = in_stack_ffffffffffffeb6c;
  m_key_name_00._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_00.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeb78;
  m_key_name_00.field_2._8_8_ = in_stack_ffffffffffffeb80;
  description_06._M_string_length = in_stack_ffffffffffffeb90._0_8_;
  description_06.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffeb90._8_16_;
  description_06._M_dataplus._M_p = in_stack_ffffffffffffeb88._M_p;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebb8;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffeba8._0_8_;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffeba8._8_8_;
  RPCResult::RPCResult(&local_690,STR_HEX,m_key_name_00,description_06,inner_06,SUB81(local_c48,0));
  std::__cxx11::string::string<std::allocator<char>>(local_c88,"wtxid",&local_12c9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_ca8,"The hash of serialized transaction, including witness data.",&local_12ca);
  local_12e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_12e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._4_12_ = in_stack_ffffffffffffeb6c;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_01.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeb78;
  m_key_name_01.field_2._8_8_ = in_stack_ffffffffffffeb80;
  description_07._M_string_length = in_stack_ffffffffffffeb90._0_8_;
  description_07.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffeb90._8_16_;
  description_07._M_dataplus._M_p = in_stack_ffffffffffffeb88._M_p;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebb8;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffeba8._0_8_;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffeba8._8_8_;
  RPCResult::RPCResult(&local_608,STR_HEX,m_key_name_01,description_07,inner_07,SUB81(local_c88,0));
  std::__cxx11::string::string<std::allocator<char>>(local_cc8,"walletconflicts",&local_12e9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_ce8,
             "Confirmed transactions that have been detected by the wallet to conflict with this transaction."
             ,&local_12ea);
  std::__cxx11::string::string<std::allocator<char>>(local_d90,"txid",&local_1309);
  std::__cxx11::string::string<std::allocator<char>>(local_db0,"The transaction id.",&local_130a);
  local_1328.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1328.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1328.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._4_12_ = in_stack_ffffffffffffeb6c;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_02.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeb78;
  m_key_name_02.field_2._8_8_ = in_stack_ffffffffffffeb80;
  description_08._M_string_length = in_stack_ffffffffffffeb90._0_8_;
  description_08.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffeb90._8_16_;
  description_08._M_dataplus._M_p = in_stack_ffffffffffffeb88._M_p;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebb8;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffeba8._0_8_;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffeba8._8_8_;
  RPCResult::RPCResult(&local_d70,STR_HEX,m_key_name_02,description_08,inner_08,SUB81(local_d90,0));
  __l._M_len = 1;
  __l._M_array = &local_d70;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_1308,__l,&local_1329);
  m_key_name_03._4_12_ = in_stack_ffffffffffffeb6c;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_03.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeb78;
  m_key_name_03.field_2._8_8_ = in_stack_ffffffffffffeb80;
  description_09._M_string_length = in_stack_ffffffffffffeb90._0_8_;
  description_09.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffeb90._8_16_;
  description_09._M_dataplus._M_p = in_stack_ffffffffffffeb88._M_p;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebb8;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffeba8._0_8_;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffeba8._8_8_;
  RPCResult::RPCResult(&local_580,ARR,m_key_name_03,description_09,inner_09,SUB81(local_cc8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_dd0,"replaced_by_txid",&local_132a);
  std::__cxx11::string::string<std::allocator<char>>
            (local_df0,"Only if \'category\' is \'send\'. The txid if this tx was replaced.",
             &local_132b);
  local_1348.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1348.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1348.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar8._12_8_ = in_stack_ffffffffffffeb78;
  auVar8._0_12_ = in_stack_ffffffffffffeb6c;
  auVar8._20_8_ = in_stack_ffffffffffffeb80;
  auVar8._28_4_ = 0;
  description_10._M_string_length = in_stack_ffffffffffffeb90._0_8_;
  description_10.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffeb90._8_16_;
  description_10._M_dataplus._M_p = in_stack_ffffffffffffeb88._M_p;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebb8;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffeba8._0_8_;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffeba8._8_8_;
  RPCResult::RPCResult
            (&local_4f8,STR_HEX,(string)(auVar8 << 0x20),SUB81(local_dd0,0),description_10,inner_10,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_e10,"replaces_txid",&local_1349);
  std::__cxx11::string::string<std::allocator<char>>
            (local_e30,"Only if \'category\' is \'send\'. The txid if this tx replaces another.",
             &local_134a);
  local_1368.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1368.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1368.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar14 = 0;
  auVar9._12_8_ = in_stack_ffffffffffffeb78;
  auVar9._0_12_ = in_stack_ffffffffffffeb6c;
  auVar9._20_8_ = in_stack_ffffffffffffeb80;
  auVar9._28_4_ = 0;
  description_11._M_string_length = in_stack_ffffffffffffeb90._0_8_;
  description_11.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffeb90._8_16_;
  description_11._M_dataplus._M_p = in_stack_ffffffffffffeb88._M_p;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebb8;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffeba8._0_8_;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffeba8._8_8_;
  RPCResult::RPCResult
            (&local_470,STR_HEX,(string)(auVar9 << 0x20),SUB81(local_e10,0),description_11,inner_11,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_e50,"mempoolconflicts",&local_1369);
  std::__cxx11::string::string<std::allocator<char>>
            (local_e70,
             "Transactions in the mempool that directly conflict with either this transaction or an ancestor transaction"
             ,&local_136a);
  std::__cxx11::string::string<std::allocator<char>>(local_f18,"txid",&local_1389);
  std::__cxx11::string::string<std::allocator<char>>(local_f38,"The transaction id.",&local_138a);
  local_13a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_13a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_04._4_12_ = in_stack_ffffffffffffeb6c;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_04.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeb78;
  m_key_name_04.field_2._8_8_ = in_stack_ffffffffffffeb80;
  description_12._M_string_length = in_stack_ffffffffffffeb90._0_8_;
  description_12.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffeb90._8_16_;
  description_12._M_dataplus._M_p = in_stack_ffffffffffffeb88._M_p;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebb8;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffeba8._0_8_;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffeba8._8_8_;
  RPCResult::RPCResult(&local_ef8,STR_HEX,m_key_name_04,description_12,inner_12,SUB81(local_f18,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_ef8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_1388,__l_00,&local_13a9);
  m_key_name_05._4_12_ = in_stack_ffffffffffffeb6c;
  m_key_name_05._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_05.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeb78;
  m_key_name_05.field_2._8_8_ = in_stack_ffffffffffffeb80;
  description_13._M_string_length = in_stack_ffffffffffffeb90._0_8_;
  description_13.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffeb90._8_16_;
  description_13._M_dataplus._M_p = in_stack_ffffffffffffeb88._M_p;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebb8;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffeba8._0_8_;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffeba8._8_8_;
  RPCResult::RPCResult(&local_3e8,ARR,m_key_name_05,description_13,inner_13,SUB81(local_e50,0));
  std::__cxx11::string::string<std::allocator<char>>(local_f58,"to",&local_13aa);
  std::__cxx11::string::string<std::allocator<char>>
            (local_f78,"If a comment to is associated with the transaction.",&local_13ab);
  local_13c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_13c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar14 = 0;
  auVar10._12_8_ = in_stack_ffffffffffffeb78;
  auVar10._0_12_ = in_stack_ffffffffffffeb6c;
  auVar10._20_8_ = in_stack_ffffffffffffeb80;
  auVar10._28_4_ = 0;
  description_14._M_string_length = in_stack_ffffffffffffeb90._0_8_;
  description_14.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffeb90._8_16_;
  description_14._M_dataplus._M_p = in_stack_ffffffffffffeb88._M_p;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebb8;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffeba8._0_8_;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffeba8._8_8_;
  RPCResult::RPCResult
            (&local_360,STR,(string)(auVar10 << 0x20),SUB81(local_f58,0),description_14,inner_14,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_f98,"time",&local_13c9);
  std::operator+(&local_fd8,"The transaction time expressed in ",&UNIX_EPOCH_TIME_abi_cxx11_);
  std::operator+(&local_fb8,&local_fd8,".");
  local_13e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_13e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_06._4_12_ = in_stack_ffffffffffffeb6c;
  m_key_name_06._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_06.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeb78;
  m_key_name_06.field_2._8_8_ = in_stack_ffffffffffffeb80;
  description_15._M_string_length = in_stack_ffffffffffffeb90._0_8_;
  description_15.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffeb90._8_16_;
  description_15._M_dataplus._M_p = in_stack_ffffffffffffeb88._M_p;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebb8;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffeba8._0_8_;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffeba8._8_8_;
  RPCResult::RPCResult(&local_2d8,NUM_TIME,m_key_name_06,description_15,inner_15,SUB81(local_f98,0))
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_ff8,"timereceived",&local_13e9);
  std::operator+(&local_1038,"The time received expressed in ",&UNIX_EPOCH_TIME_abi_cxx11_);
  std::operator+(&local_1018,&local_1038,".");
  local_1408.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1408.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1408.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_07._4_12_ = in_stack_ffffffffffffeb6c;
  m_key_name_07._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_07.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeb78;
  m_key_name_07.field_2._8_8_ = in_stack_ffffffffffffeb80;
  description_16._M_string_length = in_stack_ffffffffffffeb90._0_8_;
  description_16.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffeb90._8_16_;
  description_16._M_dataplus._M_p = in_stack_ffffffffffffeb88._M_p;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebb8;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffeba8._0_8_;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffeba8._8_8_;
  RPCResult::RPCResult(&local_250,NUM_TIME,m_key_name_07,description_16,inner_16,SUB81(local_ff8,0))
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_1058,"comment",&local_1409);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1078,
             "If a comment is associated with the transaction, only present if not empty.",
             &local_140a);
  local_1428.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1428.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1428.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar14 = 0;
  auVar11._12_8_ = in_stack_ffffffffffffeb78;
  auVar11._0_12_ = in_stack_ffffffffffffeb6c;
  auVar11._20_8_ = in_stack_ffffffffffffeb80;
  auVar11._28_4_ = 0;
  description_17._M_string_length = in_stack_ffffffffffffeb90._0_8_;
  description_17.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffeb90._8_16_;
  description_17._M_dataplus._M_p = in_stack_ffffffffffffeb88._M_p;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebb8;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffeba8._0_8_;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffeba8._8_8_;
  RPCResult::RPCResult
            (&local_1c8,STR,(string)(auVar11 << 0x20),SUB81(local_1058,0),description_17,inner_17,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_1098,"bip125-replaceable",&local_1429);
  std::__cxx11::string::string<std::allocator<char>>
            (local_10b8,
             "(\"yes|no|unknown\") Whether this transaction signals BIP125 replaceability or has an unconfirmed ancestor signaling BIP125 replaceability.\nMay be unknown for unconfirmed transactions not in the mempool because their unconfirmed ancestors are unknown."
             ,&local_142a);
  pRVar18 = (pointer)0x0;
  m_key_name_08._4_12_ = in_stack_ffffffffffffeb6c;
  m_key_name_08._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_08.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeb78;
  m_key_name_08.field_2._8_8_ = in_stack_ffffffffffffeb80;
  description_18._M_string_length = in_stack_ffffffffffffeb90._0_8_;
  description_18.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffeb90._8_16_;
  description_18._M_dataplus._M_p = in_stack_ffffffffffffeb88._M_p;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffeba8._0_8_;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffeba8._8_8_;
  RPCResult::RPCResult(&local_140,STR,m_key_name_08,description_18,inner_18,SUB81(local_1098,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_10d8,"parent_descs",(allocator<char> *)&stack0xffffffffffffebb7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_10f8,
             "Only if \'category\' is \'received\'. List of parent descriptors for the output script of this coin."
             ,(allocator<char> *)&stack0xffffffffffffebb6);
  std::__cxx11::string::string<std::allocator<char>>
            (local_11a0,"desc",(allocator<char> *)&stack0xffffffffffffeb97);
  std::__cxx11::string::string<std::allocator<char>>
            (local_11c0,"The descriptor string.",(allocator<char> *)&stack0xffffffffffffeb96);
  pRVar15 = (pointer)0x0;
  pRVar16 = (pointer)0x0;
  _Var17._M_p = (pointer)0x0;
  auVar1._24_8_ = 0;
  auVar1._0_24_ = in_stack_ffffffffffffeb90;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = pRVar18;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffeba8._0_8_;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffeba8._8_8_;
  RPCResult::RPCResult
            (&local_1180,STR,(string)ZEXT1632(CONCAT124(in_stack_ffffffffffffeb6c,uVar14)),
             (string)(auVar1 << 0x40),inner_19,SUB81(local_11a0,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_1180;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeb98,__l_01,
             (allocator_type *)&stack0xffffffffffffeb77);
  auVar12._12_8_ = pRVar15;
  auVar12._0_12_ = in_stack_ffffffffffffeb6c;
  auVar12._20_8_ = pRVar16;
  auVar12._28_4_ = 0;
  description_19._M_string_length = in_stack_ffffffffffffeb90._0_8_;
  description_19.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffeb90._8_16_;
  description_19._M_dataplus._M_p = _Var17._M_p;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = pRVar18;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffeba8._0_8_;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffeba8._8_8_;
  RPCResult::RPCResult
            (&local_b8,ARR,(string)(auVar12 << 0x20),SUB81(local_10d8,0),description_19,inner_20,
             true);
  __l_02._M_len = 0x13;
  __l_02._M_array = local_a48;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (in_RDI,__l_02,(allocator_type *)&stack0xffffffffffffeb76);
  lVar13 = 0x990;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_a48[0].m_type + lVar13));
    lVar13 = lVar13 + -0x88;
  } while (lVar13 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeb98);
  RPCResult::~RPCResult(&local_1180);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeb78);
  std::__cxx11::string::~string(local_11c0);
  std::__cxx11::string::~string(local_11a0);
  std::__cxx11::string::~string(local_10f8);
  std::__cxx11::string::~string(local_10d8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffebb8);
  std::__cxx11::string::~string(local_10b8);
  std::__cxx11::string::~string(local_1098);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1428);
  std::__cxx11::string::~string(local_1078);
  std::__cxx11::string::~string(local_1058);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1408);
  std::__cxx11::string::~string((string *)&local_1018);
  std::__cxx11::string::~string((string *)&local_1038);
  std::__cxx11::string::~string(local_ff8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_13e8);
  std::__cxx11::string::~string((string *)&local_fb8);
  std::__cxx11::string::~string((string *)&local_fd8);
  std::__cxx11::string::~string(local_f98);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_13c8);
  std::__cxx11::string::~string(local_f78);
  std::__cxx11::string::~string(local_f58);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1388);
  RPCResult::~RPCResult(&local_ef8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_13a8);
  std::__cxx11::string::~string(local_f38);
  std::__cxx11::string::~string(local_f18);
  std::__cxx11::string::~string(local_e70);
  std::__cxx11::string::~string(local_e50);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1368);
  std::__cxx11::string::~string(local_e30);
  std::__cxx11::string::~string(local_e10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1348);
  std::__cxx11::string::~string(local_df0);
  std::__cxx11::string::~string(local_dd0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1308);
  RPCResult::~RPCResult(&local_d70);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1328);
  std::__cxx11::string::~string(local_db0);
  std::__cxx11::string::~string(local_d90);
  std::__cxx11::string::~string(local_ce8);
  std::__cxx11::string::~string(local_cc8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_12e8);
  std::__cxx11::string::~string(local_ca8);
  std::__cxx11::string::~string(local_c88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_12c8);
  std::__cxx11::string::~string(local_c68);
  std::__cxx11::string::~string(local_c48);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_12a8);
  std::__cxx11::string::~string((string *)&local_c08);
  std::__cxx11::string::~string((string *)&local_c28);
  std::__cxx11::string::~string(local_be8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1288);
  std::__cxx11::string::~string(local_bc8);
  std::__cxx11::string::~string(local_ba8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1268);
  std::__cxx11::string::~string(local_b88);
  std::__cxx11::string::~string(local_b68);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1248);
  std::__cxx11::string::~string(local_b48);
  std::__cxx11::string::~string(local_b28);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1228);
  std::__cxx11::string::~string(local_b08);
  std::__cxx11::string::~string(local_ae8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1208);
  std::__cxx11::string::~string(local_ac8);
  std::__cxx11::string::~string(local_aa8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_11e8);
  std::__cxx11::string::~string(local_a88);
  std::__cxx11::string::~string(local_a68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static std::vector<RPCResult> TransactionDescriptionString()
{
    return{{RPCResult::Type::NUM, "confirmations", "The number of confirmations for the transaction. Negative confirmations means the\n"
               "transaction conflicted that many blocks ago."},
           {RPCResult::Type::BOOL, "generated", /*optional=*/true, "Only present if the transaction's only input is a coinbase one."},
           {RPCResult::Type::BOOL, "trusted", /*optional=*/true, "Whether we consider the transaction to be trusted and safe to spend from.\n"
                "Only present when the transaction has 0 confirmations (or negative confirmations, if conflicted)."},
           {RPCResult::Type::STR_HEX, "blockhash", /*optional=*/true, "The block hash containing the transaction."},
           {RPCResult::Type::NUM, "blockheight", /*optional=*/true, "The block height containing the transaction."},
           {RPCResult::Type::NUM, "blockindex", /*optional=*/true, "The index of the transaction in the block that includes it."},
           {RPCResult::Type::NUM_TIME, "blocktime", /*optional=*/true, "The block time expressed in " + UNIX_EPOCH_TIME + "."},
           {RPCResult::Type::STR_HEX, "txid", "The transaction id."},
           {RPCResult::Type::STR_HEX, "wtxid", "The hash of serialized transaction, including witness data."},
           {RPCResult::Type::ARR, "walletconflicts", "Confirmed transactions that have been detected by the wallet to conflict with this transaction.",
           {
               {RPCResult::Type::STR_HEX, "txid", "The transaction id."},
           }},
           {RPCResult::Type::STR_HEX, "replaced_by_txid", /*optional=*/true, "Only if 'category' is 'send'. The txid if this tx was replaced."},
           {RPCResult::Type::STR_HEX, "replaces_txid", /*optional=*/true, "Only if 'category' is 'send'. The txid if this tx replaces another."},
           {RPCResult::Type::ARR, "mempoolconflicts", "Transactions in the mempool that directly conflict with either this transaction or an ancestor transaction",
           {
               {RPCResult::Type::STR_HEX, "txid", "The transaction id."},
           }},
           {RPCResult::Type::STR, "to", /*optional=*/true, "If a comment to is associated with the transaction."},
           {RPCResult::Type::NUM_TIME, "time", "The transaction time expressed in " + UNIX_EPOCH_TIME + "."},
           {RPCResult::Type::NUM_TIME, "timereceived", "The time received expressed in " + UNIX_EPOCH_TIME + "."},
           {RPCResult::Type::STR, "comment", /*optional=*/true, "If a comment is associated with the transaction, only present if not empty."},
           {RPCResult::Type::STR, "bip125-replaceable", "(\"yes|no|unknown\") Whether this transaction signals BIP125 replaceability or has an unconfirmed ancestor signaling BIP125 replaceability.\n"
               "May be unknown for unconfirmed transactions not in the mempool because their unconfirmed ancestors are unknown."},
           {RPCResult::Type::ARR, "parent_descs", /*optional=*/true, "Only if 'category' is 'received'. List of parent descriptors for the output script of this coin.", {
               {RPCResult::Type::STR, "desc", "The descriptor string."},
           }},
           };
}